

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * Japanese_item_name(int i)

{
  Jitem *local_20;
  Jitem *j;
  int i_local;
  
  local_20 = Japanese_items;
  while( true ) {
    if (local_20->item == 0) {
      return (char *)0x0;
    }
    if (i == local_20->item) break;
    local_20 = local_20 + 1;
  }
  return local_20->name;
}

Assistant:

static const char *Japanese_item_name(int i)
{
	const struct Jitem *j = Japanese_items;

	while (j->item) {
		if (i == j->item)
			return j->name;
		j++;
	}
	return NULL;
}